

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  char endbracket;
  in6_addr in6;
  
  iVar3 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",&endbracket);
  if ((iVar3 == 1) && (endbracket == ']')) {
    (conn->bits).ipv6_ip = true;
    pcVar7 = (conn->host).name + 1;
    (conn->host).name = pcVar7;
    pcVar5 = strchr(pcVar7,0x5d);
    if (pcVar5 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      *pcVar5 = '\0';
      pcVar7 = (char *)0x0;
      if (pcVar5[1] == ':') {
        pcVar7 = pcVar5 + 1;
      }
    }
  }
  else {
    iVar3 = inet_pton(10,(conn->host).name,&in6);
    if (0 < iVar3) {
      Curl_failf(data,"IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
    pcVar7 = strrchr((conn->host).name,0x3a);
  }
  lVar1 = (data->set).use_port;
  if ((lVar1 == 0) || ((data->state).allow_port != true)) {
    if (pcVar7 != (char *)0x0) {
      uVar6 = strtol(pcVar7 + 1,(char **)&in6,10);
      if (uVar6 < 0x10000) {
        *pcVar7 = '\0';
        if ((char *)in6.__in6_u._0_8_ != pcVar7 + 1) {
          uVar2 = curlx_ultous(uVar6);
          conn->remote_port = (uint)uVar2;
        }
      }
      else {
        Curl_failf(data,"Port number out of range");
      }
      if (0xffff < uVar6) {
        return CURLE_URL_MALFORMAT;
      }
    }
  }
  else {
    conn->remote_port = (uint)lVar1 & 0xffff;
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    if ((conn->bits).httpproxy == true) {
      in6.__in6_u.__u6_addr32[2] = 0;
      in6.__in6_u._0_8_ = 0;
      if ((conn->bits).type_set == true) {
        uVar6 = 0x41;
        if ((data->set).prefer_ascii == false) {
          uVar6 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
        }
        curl_msnprintf((char *)&in6,0xc,";type=%c",uVar6);
      }
      pcVar7 = "[";
      bVar9 = (conn->bits).ipv6_ip == false;
      if (bVar9) {
        pcVar7 = "";
      }
      pcVar5 = "]";
      if (bVar9) {
        pcVar5 = "";
      }
      pcVar8 = "/";
      if ((data->state).slash_removed == false) {
        pcVar8 = "";
      }
      pcVar7 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar7,(conn->host).name,
                             pcVar5,(ulong)(uint)conn->remote_port,pcVar8,(data->state).path,&in6);
      if (pcVar7 == (char *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        if ((data->change).url_alloc == true) {
          (*Curl_cfree)((data->change).url);
          (data->change).url = (char *)0x0;
          (data->change).url_alloc = false;
        }
        (data->change).url = pcVar7;
        (data->change).url_alloc = true;
        CVar4 = CURLE_URL_MALFORMAT;
      }
      if (pcVar7 == (char *)0x0) {
        return CVar4;
      }
    }
  }
  if (conn->remote_port < 0) {
    conn->remote_port = (uint)(ushort)conn->given->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(':' != *portptr)
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strrchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port=strtol(portptr+1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    else if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
  }

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}